

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

void __thiscall
glcts::ViewportArray::DepthRangeAPI::compareDepthRanges<double>
          (DepthRangeAPI *this,vector<double,_std::allocator<double>_> *left,
          vector<double,_std::allocator<double>_> *right,GLchar *description,bool *out_result)

{
  double *pdVar1;
  size_t sVar2;
  pointer pdVar3;
  pointer pdVar4;
  ulong uVar5;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  pdVar3 = (left->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (left->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 != pdVar3) {
    uVar5 = 0;
    do {
      pdVar1 = (right->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start + uVar5;
      if ((pdVar3[uVar5] != *pdVar1) || (NAN(pdVar3[uVar5]) || NAN(*pdVar1))) {
        local_1b0 = (undefined1  [8])((this->super_TestCaseBase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Test case: ",0xb);
        if (description == (GLchar *)0x0) {
          std::ios::clear((int)(ostringstream *)&local_1a8 + (int)local_1a8[-3]);
        }
        else {
          sVar2 = strlen(description);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,description,sVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8," Invalid values [",0x11);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"] ",2);
        std::ostream::_M_insert<double>
                  ((left->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar5]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
        std::ostream::_M_insert<double>
                  ((right->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar5]);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        *out_result = false;
        pdVar3 = (left->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (left->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)pdVar4 - (long)pdVar3 >> 3));
  }
  return;
}

Assistant:

void DepthRangeAPI::compareDepthRanges(std::vector<T>& left, std::vector<T>& right, const GLchar* description,
									   bool& out_result)
{
	for (size_t i = 0; i < left.size(); ++i)
	{
		if (left[i] != right[i])
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << description
												<< " Invalid values [" << i << "] " << left[i] << " " << right[i]
												<< tcu::TestLog::EndMessage;
			out_result = false;
		}
	}
}